

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  AssertHelper *this_02;
  AssertHelper *this_03;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_bucknum;
  key_type *in_stack_fffffffffffffe88;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe90;
  unsigned_long *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea8;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Type type;
  AssertionResult local_110;
  value_type *in_stack_ffffffffffffff08;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff10;
  AssertionResult local_e0 [2];
  key_type local_c0;
  size_type local_b8;
  AssertionResult local_b0 [3];
  value_type local_78;
  pair<int,_int> local_64;
  int local_5c;
  size_type local_38;
  undefined4 local_2c;
  AssertionResult local_28;
  key_type local_18;
  size_type local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_18 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  local_10 = google::
             BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_2c = 0;
  local_38 = google::
             BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_size(in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             (uint *)in_stack_fffffffffffffe98,(unsigned_long *)in_stack_fffffffffffffe90);
  iVar3 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xc9c80c);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffeb0,iVar3,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0xc9c869);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9c8da);
  this_01 = (HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_78 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffeb0,(int)((ulong)this_01 >> 0x20));
  local_64 = local_78.first;
  local_5c = local_78.second;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pcVar2 = (char *)(in_RDI + 0x10);
  local_c0 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(this_01,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  local_b8 = google::
             BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)this_01,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (unsigned_long *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffea0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc9c9ea);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,pcVar2,(int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0xc9ca47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9cab5);
  this_02 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_size(in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)this_01,in_stack_fffffffffffffea0,(uint *)in_stack_fffffffffffffe98,
             (unsigned_long *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe98 =
         (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xc9cb4f);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,pcVar2,(int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(this_02,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0xc9cba3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9cc0e);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)this_01,in_stack_fffffffffffffea0,(uint *)in_stack_fffffffffffffe98,
             (unsigned_long *)in_stack_fffffffffffffe90);
  iVar3 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_03 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xc9cc94)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,pcVar2,iVar3,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(this_02,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper(this_03);
    testing::Message::~Message((Message *)0xc9cce2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9cd44);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}